

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction_tests.cpp
# Opt level: O0

void __thiscall
transaction_tests::test_big_witness_transaction::test_method(test_big_witness_transaction *this)

{
  string_view hex;
  span<const_unsigned_char,_18446744073709551615UL> b;
  bool bVar1;
  reference pvVar2;
  reference pvVar3;
  ulong uVar4;
  size_type sVar5;
  CTransaction *__args_1;
  CTransaction *pCVar6;
  SignatureCache *__args_2;
  SignatureCache *pSVar7;
  long in_FS_OFFSET;
  ParamsWrapper<TransactionSerParams,_CMutableTransaction> PVar8;
  bool controlCheck;
  uint32_t i_2;
  bool hashSigned;
  uint32_t i_1;
  uint32_t i;
  uint32_t ij;
  vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_> vChecks;
  uint32_t i_3;
  vector<Coin,_std::allocator<Coin>_> coins;
  DataStream ssout;
  vector<int,_std::allocator<int>_> sigHashes;
  CKey key;
  CMutableTransaction mtx;
  CCheckQueueControl<CScriptCheck> control;
  SignatureCache signature_cache;
  Coin coin;
  CCheckQueue<FakeCheckCheckCompletion> scriptcheckqueue;
  PrecomputedTransactionData txdata;
  CTransaction tx;
  SignatureData empty;
  COutPoint outpoint;
  CScript scriptPubKey;
  CKeyID hash;
  FillableSigningProvider keystore;
  SignatureData *in_stack_fffffffffffff328;
  __native_type *in_stack_fffffffffffff330;
  COutPoint *in_stack_fffffffffffff338;
  undefined4 in_stack_fffffffffffff340;
  int in_stack_fffffffffffff344;
  undefined7 in_stack_fffffffffffff348;
  undefined1 in_stack_fffffffffffff34f;
  undefined4 in_stack_fffffffffffff350;
  uint in_stack_fffffffffffff354;
  int *__args_4;
  CMutableTransaction *in_stack_fffffffffffff358;
  CTransaction *in_stack_fffffffffffff360;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffff368;
  FillableSigningProvider *in_stack_fffffffffffff370;
  uchar *in_stack_fffffffffffff378;
  bool *in_stack_fffffffffffff390;
  PrecomputedTransactionData **in_stack_fffffffffffff398;
  SignatureData *in_stack_fffffffffffff3b8;
  SignatureData *in_stack_fffffffffffff3d0;
  SignatureCache *in_stack_fffffffffffff3d8;
  uint uVar9;
  __native_type local_b98;
  uint local_b6c;
  ParamsWrapper<TransactionSerParams,_CMutableTransaction> local_b50;
  const_string local_aa8 [2];
  lazy_ostream local_a88 [2];
  assertion_result local_a68 [3];
  SignatureData local_a20;
  CTransaction local_618;
  SignatureData local_598;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_19c;
  undefined8 uStack_194;
  undefined8 local_18c;
  undefined8 uStack_184;
  uint32_t local_17c;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  CMutableTransaction::CMutableTransaction((CMutableTransaction *)in_stack_fffffffffffff328);
  local_a20.redeem_script.super_CScriptBase._union.indirect_contents.capacity = 1;
  GenerateRandomKey(SUB81((ulong)in_stack_fffffffffffff330 >> 0x38,0));
  FillableSigningProvider::FillableSigningProvider
            ((FillableSigningProvider *)in_stack_fffffffffffff328);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff338,
               in_stack_fffffffffffff330->__size,(unsigned_long)in_stack_fffffffffffff328);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff328);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff368._M_extent_value,
               (const_string *)in_stack_fffffffffffff360,(size_t)in_stack_fffffffffffff358,
               (const_string *)CONCAT44(in_stack_fffffffffffff354,in_stack_fffffffffffff350));
    CKey::GetPubKey((CKey *)CONCAT44(in_stack_fffffffffffff354,in_stack_fffffffffffff350));
    FillableSigningProvider::AddKeyPubKey
              (in_stack_fffffffffffff370,(CKey *)in_stack_fffffffffffff368._M_extent_value,
               (CPubKey *)in_stack_fffffffffffff360);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff338,
               SUB81((ulong)in_stack_fffffffffffff330 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff338,
               in_stack_fffffffffffff330->__size,(unsigned_long)in_stack_fffffffffffff328);
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_fffffffffffff330->__data,
               (basic_cstring<const_char> *)in_stack_fffffffffffff328);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff338,
               in_stack_fffffffffffff330->__size,(unsigned_long)in_stack_fffffffffffff328);
    in_stack_fffffffffffff328 = (SignatureData *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_a68,local_a88,local_aa8,0x213,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff328);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff328);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  CKey::GetPubKey((CKey *)CONCAT44(in_stack_fffffffffffff354,in_stack_fffffffffffff350));
  CPubKey::GetID((CPubKey *)CONCAT44(in_stack_fffffffffffff354,in_stack_fffffffffffff350));
  local_168 = 0;
  uStack_160 = 0;
  local_178 = 0;
  uStack_170 = 0;
  CScript::CScript((CScript *)in_stack_fffffffffffff328);
  CScript::operator<<((CScript *)in_stack_fffffffffffff360,
                      (opcodetype)((ulong)in_stack_fffffffffffff358 >> 0x20));
  base_blob<160U>::begin((base_blob<160U> *)in_stack_fffffffffffff328);
  base_blob<160U>::end((base_blob<160U> *)in_stack_fffffffffffff328);
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_fffffffffffff328);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff370,
             in_stack_fffffffffffff378,(uchar *)in_stack_fffffffffffff368._M_extent_value,
             (allocator_type *)in_stack_fffffffffffff360);
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_fffffffffffff338,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &in_stack_fffffffffffff330->__data);
  b._M_extent._M_extent_value = in_stack_fffffffffffff368._M_extent_value;
  b._M_ptr = (pointer)in_stack_fffffffffffff360;
  CScript::operator<<((CScript *)CONCAT17(in_stack_fffffffffffff34f,in_stack_fffffffffffff348),b);
  CScript::CScript((CScript *)in_stack_fffffffffffff328,(CScript *)0xb35e92);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff338);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_fffffffffffff328);
  CScript::~CScript((CScript *)in_stack_fffffffffffff328);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff328);
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff328,
             (value_type_conflict2 *)0xb35ef0);
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff328,
             (value_type_conflict2 *)0xb35f12);
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff328,
             (value_type_conflict2 *)0xb35f34);
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff328,
             (value_type_conflict2 *)0xb35f56);
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff328,
             (value_type_conflict2 *)0xb35f78);
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff328,
             (value_type_conflict2 *)0xb35f9a);
  for (uVar9 = 0; uVar9 < 0x1194; uVar9 = uVar9 + 1) {
    std::vector<CTxIn,_std::allocator<CTxIn>_>::size
              ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_fffffffffffff328);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(in_stack_fffffffffffff34f,in_stack_fffffffffffff348),
               (char *)CONCAT44(in_stack_fffffffffffff344,in_stack_fffffffffffff340));
    hex._M_len._7_1_ = in_stack_fffffffffffff34f;
    hex._M_len._0_7_ = in_stack_fffffffffffff348;
    hex._M_str._0_4_ = in_stack_fffffffffffff350;
    hex._M_str._4_4_ = in_stack_fffffffffffff354;
    transaction_identifier<false>::FromHex(hex);
    in_stack_fffffffffffff3d8 =
         (SignatureCache *)
         std::optional<transaction_identifier<false>_>::value
                   ((optional<transaction_identifier<false>_> *)in_stack_fffffffffffff338);
    COutPoint::COutPoint
              (in_stack_fffffffffffff338,(Txid *)&in_stack_fffffffffffff330->__data,
               (uint32_t)((ulong)in_stack_fffffffffffff328 >> 0x20));
    in_stack_fffffffffffff3d0 = &local_a20;
    std::vector<CTxIn,_std::allocator<CTxIn>_>::size
              ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_fffffffffffff328);
    std::vector<CTxIn,_std::allocator<CTxIn>_>::resize
              ((vector<CTxIn,_std::allocator<CTxIn>_> *)
               CONCAT17(in_stack_fffffffffffff34f,in_stack_fffffffffffff348),
               CONCAT44(in_stack_fffffffffffff344,in_stack_fffffffffffff340));
    in_stack_fffffffffffff3b8 = &local_a20;
    pvVar2 = std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                       ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_fffffffffffff338,
                        (size_type)in_stack_fffffffffffff330);
    (pvVar2->prevout).n = local_17c;
    *(undefined8 *)((pvVar2->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10) =
         local_18c;
    *(undefined8 *)((pvVar2->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18) =
         uStack_184;
    *(undefined8 *)(pvVar2->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems =
         local_19c;
    *(undefined8 *)((pvVar2->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8) =
         uStack_194;
    local_1d8 = 0;
    uStack_1d0 = 0;
    local_1e8 = 0;
    uStack_1e0 = 0;
    CScript::CScript((CScript *)in_stack_fffffffffffff328);
    std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
              ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_fffffffffffff338,
               (size_type)in_stack_fffffffffffff330);
    CScript::operator=((CScript *)in_stack_fffffffffffff338,
                       (CScript *)&in_stack_fffffffffffff330->__data);
    CScript::~CScript((CScript *)in_stack_fffffffffffff328);
    std::vector<CTxOut,_std::allocator<CTxOut>_>::size
              ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffff328);
    std::vector<CTxOut,_std::allocator<CTxOut>_>::resize
              ((vector<CTxOut,_std::allocator<CTxOut>_> *)
               CONCAT17(in_stack_fffffffffffff34f,in_stack_fffffffffffff348),
               CONCAT44(in_stack_fffffffffffff344,in_stack_fffffffffffff340));
    pvVar3 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                       ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffff338,
                        (size_type)in_stack_fffffffffffff330);
    pvVar3->nValue = 1000;
    local_1f8 = 0;
    uStack_1f0 = 0;
    local_208 = 0;
    uStack_200 = 0;
    CScript::CScript((CScript *)in_stack_fffffffffffff328);
    CScript::operator<<((CScript *)in_stack_fffffffffffff360,
                        (opcodetype)((ulong)in_stack_fffffffffffff358 >> 0x20));
    std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
              ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffff338,
               (size_type)in_stack_fffffffffffff330);
    CScript::operator=((CScript *)in_stack_fffffffffffff338,
                       (CScript *)&in_stack_fffffffffffff330->__data);
    CScript::~CScript((CScript *)in_stack_fffffffffffff328);
  }
  uVar9 = 0;
  while( true ) {
    uVar4 = (ulong)uVar9;
    sVar5 = std::vector<CTxIn,_std::allocator<CTxIn>_>::size
                      ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_fffffffffffff328);
    if (sVar5 <= uVar4) break;
    SignatureData::SignatureData(in_stack_fffffffffffff3b8);
    in_stack_fffffffffffff390 = (bool *)(ulong)uVar9;
    std::vector<int,_std::allocator<int>_>::size
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff328);
    in_stack_fffffffffffff398 =
         (PrecomputedTransactionData **)
         std::vector<int,_std::allocator<int>_>::at
                   ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff338,
                    (size_type)in_stack_fffffffffffff330);
    in_stack_fffffffffffff328 = &local_598;
    bVar1 = SignSignature((SigningProvider *)in_stack_fffffffffffff368._M_extent_value,
                          (CScript *)in_stack_fffffffffffff360,in_stack_fffffffffffff358,
                          in_stack_fffffffffffff354,
                          (CAmount *)CONCAT17(in_stack_fffffffffffff34f,in_stack_fffffffffffff348),
                          in_stack_fffffffffffff344,in_stack_fffffffffffff3d0);
    if (!bVar1) {
      __assert_fail("hashSigned",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
                    ,0x231,"void transaction_tests::test_big_witness_transaction::test_method()");
    }
    SignatureData::~SignatureData(in_stack_fffffffffffff328);
    uVar9 = uVar9 + 1;
  }
  DataStream::DataStream((DataStream *)in_stack_fffffffffffff328);
  PVar8 = TransactionSerParams::operator()
                    ((TransactionSerParams *)in_stack_fffffffffffff338,
                     (CMutableTransaction *)&in_stack_fffffffffffff330->__data);
  local_b50 = PVar8;
  DataStream::operator<<
            ((DataStream *)in_stack_fffffffffffff338,
             (ParamsWrapper<TransactionSerParams,_CMutableTransaction> *)
             &in_stack_fffffffffffff330->__data);
  CTransaction::CTransaction<DataStream>(&local_618,&::TX_WITH_WITNESS,&stack0xfffffffffffff4c0);
  PrecomputedTransactionData::PrecomputedTransactionData<CTransaction>
            ((PrecomputedTransactionData *)in_stack_fffffffffffff368._M_extent_value,
             in_stack_fffffffffffff360);
  CCheckQueue<CScriptCheck>::CCheckQueue
            ((CCheckQueue<FakeCheckCheckCompletion> *)PVar8.m_params,PVar8.m_object._4_4_,
             (int)PVar8.m_object);
  CCheckQueueControl<CScriptCheck>::CCheckQueueControl
            ((CCheckQueueControl<CScriptCheck> *)in_stack_fffffffffffff338,
             (CCheckQueue<FakeCheckCheckCompletion> *)&in_stack_fffffffffffff330->__data);
  std::vector<Coin,_std::allocator<Coin>_>::vector
            ((vector<Coin,_std::allocator<Coin>_> *)in_stack_fffffffffffff328);
  uVar9 = 0;
  while( true ) {
    __args_1 = (CTransaction *)(ulong)uVar9;
    pCVar6 = (CTransaction *)
             std::vector<CTxIn,_std::allocator<CTxIn>_>::size
                       ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_fffffffffffff328);
    if (pCVar6 <= __args_1) break;
    Coin::Coin((Coin *)in_stack_fffffffffffff328);
    local_a20.taproot_script_sigs._M_t._M_impl._0_4_ = 2;
    local_a20.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x3e8;
    CScript::operator=((CScript *)in_stack_fffffffffffff338,
                       (CScript *)&in_stack_fffffffffffff330->__data);
    std::vector<Coin,_std::allocator<Coin>_>::emplace_back<Coin>
              ((vector<Coin,_std::allocator<Coin>_> *)
               CONCAT17(in_stack_fffffffffffff34f,in_stack_fffffffffffff348),
               (Coin *)CONCAT44(in_stack_fffffffffffff344,in_stack_fffffffffffff340));
    Coin::~Coin((Coin *)in_stack_fffffffffffff328);
    uVar9 = uVar9 + 1;
  }
  SignatureCache::SignatureCache(in_stack_fffffffffffff3d8,(size_t)in_stack_fffffffffffff3d0);
  local_b6c = 0;
  while( true ) {
    __args_2 = (SignatureCache *)(ulong)local_b6c;
    pSVar7 = (SignatureCache *)
             std::vector<CTxIn,_std::allocator<CTxIn>_>::size
                       ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_fffffffffffff328);
    if (pSVar7 <= __args_2) break;
    __args_4 = &local_b98.__data.__kind;
    std::vector<CScriptCheck,_std::allocator<CScriptCheck>_>::vector
              ((vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_> *)
               in_stack_fffffffffffff328);
    pCVar6 = &local_618;
    std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
              ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_fffffffffffff338,
               (size_type)in_stack_fffffffffffff330);
    std::vector<Coin,_std::allocator<Coin>_>::operator[]
              ((vector<Coin,_std::allocator<Coin>_> *)in_stack_fffffffffffff338,
               (size_type)in_stack_fffffffffffff330);
    local_b98.__data.__nusers = 0x801;
    local_b98.__size[0xb] = '\0';
    local_b98.__align =
         (long)&local_a20.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header + 8;
    in_stack_fffffffffffff330 = &local_b98;
    in_stack_fffffffffffff328 = (SignatureData *)((long)&local_b98.__data.__owner + 3);
    std::vector<CScriptCheck,std::allocator<CScriptCheck>>::
    emplace_back<CTxOut&,CTransaction&,SignatureCache&,unsigned_int&,unsigned_int,bool,PrecomputedTransactionData*>
              ((vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_> *)
               PVar8.m_params,(CTxOut *)PVar8.m_object,__args_1,__args_2,(uint *)pCVar6,
               (uint *)__args_4,in_stack_fffffffffffff390,in_stack_fffffffffffff398);
    CCheckQueueControl<CScriptCheck>::Add
              ((CCheckQueueControl<CScriptCheck> *)in_stack_fffffffffffff338,
               (vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_> *)
               &in_stack_fffffffffffff330->__data);
    std::vector<CScriptCheck,_std::allocator<CScriptCheck>_>::~vector
              ((vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_> *)
               in_stack_fffffffffffff338);
    local_b6c = local_b6c + 1;
  }
  bVar1 = CCheckQueueControl<CScriptCheck>::Wait
                    ((CCheckQueueControl<CScriptCheck> *)
                     CONCAT44(in_stack_fffffffffffff344,in_stack_fffffffffffff340));
  if (bVar1) {
    SignatureCache::~SignatureCache((SignatureCache *)in_stack_fffffffffffff328);
    std::vector<Coin,_std::allocator<Coin>_>::~vector
              ((vector<Coin,_std::allocator<Coin>_> *)in_stack_fffffffffffff338);
    CCheckQueueControl<CScriptCheck>::~CCheckQueueControl
              ((CCheckQueueControl<CScriptCheck> *)in_stack_fffffffffffff338);
    CCheckQueue<CScriptCheck>::~CCheckQueue
              ((CCheckQueue<FakeCheckCheckCompletion> *)
               CONCAT44(in_stack_fffffffffffff344,in_stack_fffffffffffff340));
    PrecomputedTransactionData::~PrecomputedTransactionData
              ((PrecomputedTransactionData *)in_stack_fffffffffffff328);
    CTransaction::~CTransaction((CTransaction *)in_stack_fffffffffffff328);
    DataStream::~DataStream((DataStream *)in_stack_fffffffffffff328);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff338);
    CScript::~CScript((CScript *)in_stack_fffffffffffff328);
    FillableSigningProvider::~FillableSigningProvider
              ((FillableSigningProvider *)in_stack_fffffffffffff328);
    CKey::~CKey((CKey *)in_stack_fffffffffffff328);
    CMutableTransaction::~CMutableTransaction((CMutableTransaction *)in_stack_fffffffffffff328);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      return;
    }
    __stack_chk_fail();
  }
  __assert_fail("controlCheck",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
                ,0x250,"void transaction_tests::test_big_witness_transaction::test_method()");
}

Assistant:

BOOST_AUTO_TEST_CASE(test_big_witness_transaction)
{
    CMutableTransaction mtx;
    mtx.version = 1;

    CKey key = GenerateRandomKey(); // Need to use compressed keys in segwit or the signing will fail
    FillableSigningProvider keystore;
    BOOST_CHECK(keystore.AddKeyPubKey(key, key.GetPubKey()));
    CKeyID hash = key.GetPubKey().GetID();
    CScript scriptPubKey = CScript() << OP_0 << std::vector<unsigned char>(hash.begin(), hash.end());

    std::vector<int> sigHashes;
    sigHashes.push_back(SIGHASH_NONE | SIGHASH_ANYONECANPAY);
    sigHashes.push_back(SIGHASH_SINGLE | SIGHASH_ANYONECANPAY);
    sigHashes.push_back(SIGHASH_ALL | SIGHASH_ANYONECANPAY);
    sigHashes.push_back(SIGHASH_NONE);
    sigHashes.push_back(SIGHASH_SINGLE);
    sigHashes.push_back(SIGHASH_ALL);

    // create a big transaction of 4500 inputs signed by the same key
    for(uint32_t ij = 0; ij < 4500; ij++) {
        uint32_t i = mtx.vin.size();
        COutPoint outpoint(Txid::FromHex("0000000000000000000000000000000000000000000000000000000000000100").value(), i);

        mtx.vin.resize(mtx.vin.size() + 1);
        mtx.vin[i].prevout = outpoint;
        mtx.vin[i].scriptSig = CScript();

        mtx.vout.resize(mtx.vout.size() + 1);
        mtx.vout[i].nValue = 1000;
        mtx.vout[i].scriptPubKey = CScript() << OP_1;
    }

    // sign all inputs
    for(uint32_t i = 0; i < mtx.vin.size(); i++) {
        SignatureData empty;
        bool hashSigned = SignSignature(keystore, scriptPubKey, mtx, i, 1000, sigHashes.at(i % sigHashes.size()), empty);
        assert(hashSigned);
    }

    DataStream ssout;
    ssout << TX_WITH_WITNESS(mtx);
    CTransaction tx(deserialize, TX_WITH_WITNESS, ssout);

    // check all inputs concurrently, with the cache
    PrecomputedTransactionData txdata(tx);
    CCheckQueue<CScriptCheck> scriptcheckqueue(/*batch_size=*/128, /*worker_threads_num=*/20);
    CCheckQueueControl<CScriptCheck> control(&scriptcheckqueue);

    std::vector<Coin> coins;
    for(uint32_t i = 0; i < mtx.vin.size(); i++) {
        Coin coin;
        coin.nHeight = 1;
        coin.fCoinBase = false;
        coin.out.nValue = 1000;
        coin.out.scriptPubKey = scriptPubKey;
        coins.emplace_back(std::move(coin));
    }

    SignatureCache signature_cache{DEFAULT_SIGNATURE_CACHE_BYTES};

    for(uint32_t i = 0; i < mtx.vin.size(); i++) {
        std::vector<CScriptCheck> vChecks;
        vChecks.emplace_back(coins[tx.vin[i].prevout.n].out, tx, signature_cache, i, SCRIPT_VERIFY_P2SH | SCRIPT_VERIFY_WITNESS, false, &txdata);
        control.Add(std::move(vChecks));
    }

    bool controlCheck = control.Wait();
    assert(controlCheck);
}